

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

__m128i get_recon_8x8(__m128i pred,__m128i res_lo,__m128i res_hi,int fliplr,int bd)

{
  undefined1 auVar1 [16];
  int in_EDX;
  ulong in_RSI;
  int in_EDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  __m128i alVar2;
  __m128i u;
  __m128i zero;
  __m128i x1;
  __m128i x0;
  undefined2 uStack_154;
  undefined2 uStack_152;
  undefined2 uStack_14c;
  undefined2 uStack_14a;
  undefined1 local_148 [16];
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_f4;
  undefined4 uStack_ec;
  undefined4 uStack_b4;
  undefined4 uStack_ac;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined2 local_58;
  undefined2 uStack_56;
  undefined2 uStack_54;
  undefined2 uStack_52;
  undefined2 uStack_10;
  undefined2 uStack_e;
  undefined2 uStack_c;
  undefined2 uStack_a;
  
  local_58 = (ushort)in_XMM0_Qa;
  uStack_56 = (ushort)((ulong)in_XMM0_Qa >> 0x10);
  uStack_54 = (ushort)((ulong)in_XMM0_Qa >> 0x20);
  uStack_52 = (ushort)((ulong)in_XMM0_Qa >> 0x30);
  local_148._2_2_ = 0;
  local_148._0_2_ = local_58;
  uStack_10 = (ushort)in_XMM0_Qb;
  uStack_e = (ushort)((ulong)in_XMM0_Qb >> 0x10);
  uStack_c = (ushort)((ulong)in_XMM0_Qb >> 0x20);
  uStack_a = (ushort)((ulong)in_XMM0_Qb >> 0x30);
  local_118 = (int)in_XMM1_Qa;
  uStack_114 = (int)((ulong)in_XMM1_Qa >> 0x20);
  uStack_110 = (int)in_XMM1_Qb;
  uStack_10c = (int)((ulong)in_XMM1_Qb >> 0x20);
  local_128 = (int)in_XMM2_Qa;
  uStack_124 = (int)((ulong)in_XMM2_Qa >> 0x20);
  uStack_120 = (int)in_XMM2_Qb;
  uStack_11c = (int)((ulong)in_XMM2_Qb >> 0x20);
  uStack_94 = (uint)uStack_56;
  uStack_90 = (uint)uStack_54;
  uStack_8c = (uint)uStack_52;
  if (in_EDI == 0) {
    local_148._4_4_ = uStack_114 + uStack_94;
    local_148._0_4_ = local_118 + local_148._0_4_;
    local_148._8_4_ = uStack_110 + uStack_90;
    local_148._12_4_ = uStack_10c + uStack_8c;
    uStack_f4 = (uint)uStack_e;
    uStack_ec = (uint)uStack_a;
    uStack_10c = local_128 + (uint)uStack_10;
    uStack_110 = uStack_124 + uStack_f4;
    uStack_114 = uStack_120 + (uint)uStack_c;
    local_118 = uStack_11c + uStack_ec;
  }
  else {
    local_148._4_4_ = uStack_120 + uStack_94;
    local_148._0_4_ = uStack_11c + local_148._0_4_;
    local_148._8_4_ = uStack_124 + uStack_90;
    local_148._12_4_ = local_128 + uStack_8c;
    uStack_b4 = (uint)uStack_e;
    uStack_ac = (uint)uStack_a;
    uStack_10c = uStack_10c + (uint)uStack_10;
    uStack_110 = uStack_110 + uStack_b4;
    uStack_114 = uStack_114 + (uint)uStack_c;
    local_118 = local_118 + uStack_ac;
  }
  uStack_14a = (undefined2)((uint)local_118 >> 0x10);
  uStack_14c = (undefined2)local_118;
  uStack_152 = (undefined2)((uint)uStack_110 >> 0x10);
  uStack_154 = (undefined2)uStack_110;
  auVar1._4_2_ = uStack_154;
  auVar1._0_4_ = uStack_10c;
  auVar1._6_2_ = uStack_152;
  auVar1._12_2_ = uStack_14c;
  auVar1._8_4_ = uStack_114;
  auVar1._14_2_ = uStack_14a;
  packusdw(local_148,auVar1);
  u[0] = in_RSI & 0xffffffff;
  u[1] = in_RSI;
  alVar2 = highbd_clamp_epi16(u,in_EDX);
  alVar2[0] = alVar2[0];
  alVar2[1] = alVar2[1];
  return alVar2;
}

Assistant:

static __m128i get_recon_8x8(const __m128i pred, __m128i res_lo, __m128i res_hi,
                             int fliplr, int bd) {
  __m128i x0, x1;
  const __m128i zero = _mm_setzero_si128();

  x0 = _mm_unpacklo_epi16(pred, zero);
  x1 = _mm_unpackhi_epi16(pred, zero);

  if (fliplr) {
    res_lo = _mm_shuffle_epi32(res_lo, 0x1B);
    res_hi = _mm_shuffle_epi32(res_hi, 0x1B);
    x0 = _mm_add_epi32(res_hi, x0);
    x1 = _mm_add_epi32(res_lo, x1);

  } else {
    x0 = _mm_add_epi32(res_lo, x0);
    x1 = _mm_add_epi32(res_hi, x1);
  }

  x0 = _mm_packus_epi32(x0, x1);
  return highbd_clamp_epi16(x0, bd);
}